

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O0

size_t EntityRelationTask::predict_relation
                 (search *sch,example *ex,v_array<unsigned_long> *predictions,ptag my_tag,bool isLdf
                 )

{
  v_array<char> tag;
  bool bVar1;
  uint uVar2;
  action aVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  predictor *ppVar6;
  predictor *this;
  size_t sVar7;
  polylabel *this_00;
  wclass *pwVar8;
  uint *puVar9;
  ulong i;
  v_array<unsigned_long> *in_RDX;
  long in_RSI;
  search *in_RDI;
  byte in_R8B;
  float loss;
  size_t pred_pos;
  label *lab;
  size_t a;
  int correct_label;
  v_array<unsigned_int> star_labels;
  size_t prediction;
  size_t j;
  v_array<unsigned_int> constrained_relation_labels;
  size_t hist [2];
  task_data *my_task_data;
  int id2;
  int id1;
  char type;
  example *input_example;
  float loss_00;
  predictor *this_01;
  example *input_example_00;
  example *src;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  predictor *in_stack_fffffffffffffb80;
  size_t in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  example *in_stack_fffffffffffffbb8;
  undefined8 in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffc00;
  ptag my_tag_00;
  search *in_stack_fffffffffffffc08;
  predictor *in_stack_fffffffffffffc10;
  int *in_stack_fffffffffffffc20;
  int *in_stack_fffffffffffffc28;
  char *in_stack_fffffffffffffc30;
  predictor *in_stack_fffffffffffffc38;
  undefined8 in_stack_fffffffffffffc40;
  undefined8 in_stack_fffffffffffffc48;
  undefined8 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  ulong local_1c0;
  ulong local_98;
  size_t local_90;
  v_array<unsigned_int> local_88;
  example *local_68;
  predictor *local_60;
  example *local_58;
  example *local_50;
  unsigned_long local_48;
  unsigned_long local_40;
  task_data *local_30;
  int local_28;
  int local_24;
  byte local_1d;
  v_array<unsigned_long> *local_18;
  long local_10;
  
  local_1d = in_R8B & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = Search::search::get_task_data<EntityRelationTask::task_data>(in_RDI);
  input_example = *(example **)(local_10 + 0x6878);
  this_01 = *(predictor **)(local_10 + 0x6880);
  input_example_00 = *(example **)(local_10 + 0x6888);
  src = *(example **)(local_10 + 0x6890);
  tag._end = (char *)in_stack_fffffffffffffc48;
  tag._begin = (char *)in_stack_fffffffffffffc40;
  tag.end_array = (char *)in_stack_fffffffffffffc50;
  tag.erase_count._0_4_ = in_stack_fffffffffffffc58;
  tag.erase_count._4_4_ = in_stack_fffffffffffffc5c;
  local_68 = input_example;
  local_60 = this_01;
  local_58 = input_example_00;
  local_50 = src;
  decode_tag(tag,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  v_init<unsigned_int>();
  if ((((local_30->constraints & 1U) == 0) ||
      (puVar4 = v_array<unsigned_long>::operator[](local_18,(long)local_24), *puVar4 == 0)) ||
     (puVar4 = v_array<unsigned_long>::operator[](local_18,(long)local_28), *puVar4 == 0)) {
    local_48 = 0;
    local_40 = 0;
  }
  else {
    puVar4 = v_array<unsigned_long>::operator[](local_18,(long)local_24);
    local_48 = *puVar4;
    puVar4 = v_array<unsigned_long>::operator[](local_18,(long)local_28);
    local_40 = *puVar4;
  }
  local_90 = 0;
  do {
    sVar7 = local_90;
    sVar5 = v_array<unsigned_int>::size(&local_30->y_allowed_relation);
    my_tag_00 = (ptag)((ulong)in_stack_fffffffffffffc00 >> 0x20);
    if (sVar5 <= sVar7) {
      if ((local_30->allow_skip & 1U) == 0) {
        if ((local_1d & 1) == 0) {
          Search::predictor::predictor
                    (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,my_tag_00);
          Search::predictor::set_input(this_01,input_example);
          loss_00 = (float)((ulong)input_example >> 0x20);
          Search::predictor::set_oracle(this_01,(action)loss_00);
          ppVar6 = Search::predictor::set_allowed
                             (in_stack_fffffffffffffb80,
                              (v_array<unsigned_int> *)
                              CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
          Search::predictor::set_learner_id(ppVar6,1);
          uVar2 = Search::predictor::predict(in_stack_fffffffffffffc38);
          Search::predictor::~predictor(this_01);
        }
        else {
          local_1c0 = 0;
          while( true ) {
            sVar7 = v_array<unsigned_int>::size(&local_88);
            loss_00 = (float)((ulong)input_example >> 0x20);
            if (sVar7 <= local_1c0) break;
            VW::copy_example_data
                      (SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0),
                       (example *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),src)
            ;
            v_array<unsigned_int>::operator[](&local_88,local_1c0);
            update_example_indicies
                      (SUB81((ulong)in_stack_fffffffffffffbc0 >> 0x38,0),in_stack_fffffffffffffbb8,
                       CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                       in_stack_fffffffffffffba8);
            this_00 = &local_30->ldf_relation[local_1c0].l;
            pwVar8 = v_array<COST_SENSITIVE::wclass>::operator[]
                               ((v_array<COST_SENSITIVE::wclass> *)&this_00->simple,0);
            pwVar8->x = 0.0;
            puVar9 = v_array<unsigned_int>::operator[](&local_88,local_1c0);
            uVar2 = *puVar9;
            pwVar8 = v_array<COST_SENSITIVE::wclass>::operator[]
                               ((v_array<COST_SENSITIVE::wclass> *)&this_00->simple,0);
            pwVar8->class_index = uVar2;
            pwVar8 = v_array<COST_SENSITIVE::wclass>::operator[]
                               ((v_array<COST_SENSITIVE::wclass> *)&this_00->simple,0);
            pwVar8->partial_prediction = 0.0;
            pwVar8 = v_array<COST_SENSITIVE::wclass>::operator[]
                               ((v_array<COST_SENSITIVE::wclass> *)&this_00->simple,0);
            pwVar8->wap_value = 0.0;
            v_array<unsigned_int>::operator[](&local_88,local_1c0);
            local_1c0 = local_1c0 + 1;
          }
          Search::predictor::predictor
                    (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                     (ptag)((ulong)in_stack_fffffffffffffc00 >> 0x20));
          v_array<unsigned_int>::size(&local_88);
          Search::predictor::set_input((predictor *)src,input_example_00,(size_t)this_01);
          ppVar6 = Search::predictor::set_oracle(this_01,(action)loss_00);
          Search::predictor::set_learner_id(ppVar6,2);
          aVar3 = Search::predictor::predict(in_stack_fffffffffffffc38);
          i = (ulong)aVar3;
          Search::predictor::~predictor(this_01);
          puVar9 = v_array<unsigned_int>::operator[](&local_88,i);
          uVar2 = *puVar9;
        }
      }
      else {
        v_init<unsigned_int>();
        v_array<unsigned_int>::push_back((v_array<unsigned_int> *)this_01,(uint *)input_example);
        v_array<unsigned_int>::push_back((v_array<unsigned_int> *)this_01,(uint *)input_example);
        v_array<unsigned_int>::push_back((v_array<unsigned_int> *)this_01,(uint *)input_example);
        Search::predictor::predictor(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,my_tag_00);
        ppVar6 = Search::predictor::set_input(this_01,input_example);
        Search::predictor::set_oracle
                  (in_stack_fffffffffffffb80,
                   (v_array<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        this = Search::predictor::set_allowed
                         (in_stack_fffffffffffffb80,
                          (v_array<unsigned_int> *)
                          CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        Search::predictor::set_learner_id(this,2);
        Search::predictor::add_condition
                  (this_01,(ptag)((ulong)input_example >> 0x20),(char)((ulong)input_example >> 0x18)
                  );
        Search::predictor::add_condition
                  (this_01,(ptag)((ulong)input_example >> 0x20),(char)((ulong)input_example >> 0x18)
                  );
        loss_00 = (float)((ulong)input_example >> 0x20);
        uVar2 = Search::predictor::predict(ppVar6);
        Search::predictor::~predictor(this_01);
        v_array<unsigned_int>::pop(&local_88);
      }
      local_98 = (ulong)uVar2;
      Search::search::loss((search *)this_01,loss_00);
      v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)this_01);
      return local_98;
    }
    if (((local_30->constraints & 1U) == 0) || (local_48 == 0)) {
LAB_00469f7f:
      v_array<unsigned_int>::operator[](&local_30->y_allowed_relation,local_90);
      v_array<unsigned_int>::push_back((v_array<unsigned_int> *)this_01,(uint *)input_example);
    }
    else {
      v_array<unsigned_int>::operator[](&local_30->y_allowed_relation,local_90);
      bVar1 = check_constraints((size_t)in_stack_fffffffffffffbb8,
                                CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                                in_stack_fffffffffffffba8);
      if (bVar1) goto LAB_00469f7f;
    }
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

size_t predict_relation(Search::search& sch, example* ex, v_array<size_t>& predictions, ptag my_tag, bool isLdf = false)
{
  char type;
  int id1, id2;
  task_data* my_task_data = sch.get_task_data<task_data>();
  size_t hist[2];
  decode_tag(ex->tag, type, id1, id2);
  v_array<uint32_t> constrained_relation_labels = v_init<uint32_t>();
  if (my_task_data->constraints && predictions[id1] != 0 && predictions[id2] != 0)
  {
    hist[0] = predictions[id1];
    hist[1] = predictions[id2];
  }
  else
  {
    hist[0] = 0;
    hist[1] = 0;
  }
  for (size_t j = 0; j < my_task_data->y_allowed_relation.size(); j++)
  {
    if (!my_task_data->constraints || hist[0] == (size_t)0 ||
        check_constraints(hist[0], hist[1], my_task_data->y_allowed_relation[j]))
      constrained_relation_labels.push_back(my_task_data->y_allowed_relation[j]);
  }

  size_t prediction;
  if (my_task_data->allow_skip)
  {
    v_array<uint32_t> star_labels = v_init<uint32_t>();
    star_labels.push_back(ex->l.multi.label);
    star_labels.push_back(LABEL_SKIP);
    constrained_relation_labels.push_back(LABEL_SKIP);
    prediction = Search::predictor(sch, my_tag)
                     .set_input(*ex)
                     .set_oracle(star_labels)
                     .set_allowed(constrained_relation_labels)
                     .set_learner_id(2)
                     .add_condition(id1, 'a')
                     .add_condition(id2, 'b')
                     .predict();
    constrained_relation_labels.pop();
  }
  else
  {
    if (isLdf)
    {
      int correct_label = 0;  // if correct label is not in the set, use the first one
      for (size_t a = 0; a < constrained_relation_labels.size(); a++)
      {
        VW::copy_example_data(false, &my_task_data->ldf_relation[a], ex);
        update_example_indicies(
            true, &my_task_data->ldf_relation[a], 28904713, 4832917 * (uint64_t)(constrained_relation_labels[a]));
        CS::label& lab = my_task_data->ldf_relation[a].l.cs;
        lab.costs[0].x = 0.f;
        lab.costs[0].class_index = constrained_relation_labels[a];
        lab.costs[0].partial_prediction = 0.f;
        lab.costs[0].wap_value = 0.f;
        if (constrained_relation_labels[a] == ex->l.multi.label)
        {
          correct_label = (int)a;
        }
      }
      size_t pred_pos = Search::predictor(sch, my_tag)
                            .set_input(my_task_data->ldf_relation, constrained_relation_labels.size())
                            .set_oracle(correct_label)
                            .set_learner_id(2)
                            .predict();
      prediction = constrained_relation_labels[pred_pos];
    }
    else
    {
      prediction = Search::predictor(sch, my_tag)
                       .set_input(*ex)
                       .set_oracle(ex->l.multi.label)
                       .set_allowed(constrained_relation_labels)
                       .set_learner_id(1)
                       .predict();
    }
  }

  float loss = 0.0;
  if (prediction == LABEL_SKIP)
  {
    loss = my_task_data->skip_cost;
  }
  else if (prediction != ex->l.multi.label)
  {
    if (ex->l.multi.label == R_NONE)
    {
      loss = my_task_data->relation_none_cost;
    }
    else
    {
      loss = my_task_data->relation_cost;
    }
  }
  sch.loss(loss);
  constrained_relation_labels.delete_v();
  return prediction;
}